

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O0

bool __thiscall Lexer::Error(Lexer *this,string *message,string *err)

{
  undefined8 uVar1;
  ulong uVar2;
  int local_4fc;
  allocator<char> local_4e9;
  string local_4e8 [39];
  allocator local_4c1;
  string local_4c0 [35];
  byte local_49d;
  int local_49c;
  undefined4 uStack_498;
  bool truncated;
  int len;
  int kTruncateColumn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  string local_468;
  char local_448 [8];
  char buf [1024];
  char *pcStack_38;
  int col;
  char *p;
  char *line_start;
  int line;
  string *err_local;
  string *message_local;
  Lexer *this_local;
  
  line_start._4_4_ = 1;
  p = (this->input_).str_;
  for (pcStack_38 = (this->input_).str_; pcStack_38 < this->last_token_; pcStack_38 = pcStack_38 + 1
      ) {
    if (*pcStack_38 == '\n') {
      line_start._4_4_ = line_start._4_4_ + 1;
      p = pcStack_38 + 1;
    }
  }
  if (this->last_token_ == (char *)0x0) {
    local_4fc = 0;
  }
  else {
    local_4fc = (int)this->last_token_ - (int)p;
  }
  StringPiece::AsString_abi_cxx11_(&local_468,&this->filename_);
  uVar1 = std::__cxx11::string::c_str();
  snprintf(local_448,0x400,"%s:%d: ",uVar1,(ulong)line_start._4_4_);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::operator=((string *)err,local_448);
  std::operator+(&local_488,message,"\n");
  std::__cxx11::string::operator+=((string *)err,(string *)&local_488);
  std::__cxx11::string::~string((string *)&local_488);
  uStack_498 = 0x48;
  if ((0 < local_4fc) && (local_4fc < 0x48)) {
    local_49d = 1;
    for (local_49c = 0; local_49c < 0x48; local_49c = local_49c + 1) {
      if ((p[local_49c] == '\0') || (p[local_49c] == '\n')) {
        local_49d = 0;
        break;
      }
    }
    uVar2 = (ulong)local_49c;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4c0,p,uVar2,&local_4c1);
    std::__cxx11::string::operator+=((string *)err,local_4c0);
    std::__cxx11::string::~string(local_4c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
    if ((local_49d & 1) != 0) {
      std::__cxx11::string::operator+=((string *)err,"...");
    }
    std::__cxx11::string::operator+=((string *)err,"\n");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_4e8,(long)local_4fc,' ',&local_4e9);
    std::__cxx11::string::operator+=((string *)err,local_4e8);
    std::__cxx11::string::~string(local_4e8);
    std::allocator<char>::~allocator(&local_4e9);
    std::__cxx11::string::operator+=((string *)err,"^ near here");
  }
  return false;
}

Assistant:

bool Lexer::Error(const string& message, string* err) {
  // Compute line/column.
  int line = 1;
  const char* line_start = input_.str_;
  for (const char* p = input_.str_; p < last_token_; ++p) {
    if (*p == '\n') {
      ++line;
      line_start = p + 1;
    }
  }
  int col = last_token_ ? (int)(last_token_ - line_start) : 0;

  char buf[1024];
  snprintf(buf, sizeof(buf), "%s:%d: ", filename_.AsString().c_str(), line);
  *err = buf;
  *err += message + "\n";

  // Add some context to the message.
  const int kTruncateColumn = 72;
  if (col > 0 && col < kTruncateColumn) {
    int len;
    bool truncated = true;
    for (len = 0; len < kTruncateColumn; ++len) {
      if (line_start[len] == 0 || line_start[len] == '\n') {
        truncated = false;
        break;
      }
    }
    *err += string(line_start, len);
    if (truncated)
      *err += "...";
    *err += "\n";
    *err += string(col, ' ');
    *err += "^ near here";
  }

  return false;
}